

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O1

int cram_put_bam_seq(cram_fd *fd,bam_seq_t *b)

{
  uint uVar1;
  spare_bams *__ptr;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cram_container *pcVar6;
  cram_slice *pcVar7;
  int *piVar8;
  bam_seq_t **ppbVar9;
  bam1_t *pbVar10;
  cram_block_slice_hdr *pcVar11;
  int32_t iVar12;
  bam_seq_t *pbVar13;
  long lVar14;
  bool bVar15;
  
  if (fd->ctr == (cram_container *)0x0) {
    pcVar6 = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
    fd->ctr = pcVar6;
    if (pcVar6 != (cram_container *)0x0) {
      pcVar6->record_counter = fd->record_counter;
      goto LAB_00129a76;
    }
LAB_00129fc0:
    iVar5 = -1;
  }
  else {
LAB_00129a76:
    pcVar6 = fd->ctr;
    if (((pcVar6->slice == (cram_slice *)0x0) || (pcVar6->curr_rec == pcVar6->max_rec)) ||
       (-2 < pcVar6->curr_ref && (b->core).tid != pcVar6->curr_ref)) {
      bVar15 = fd->multi_seq == 1;
      pbVar13 = (bam_seq_t *)&pcVar6->curr_ref;
      if (pcVar6->slice == (cram_slice *)0x0) {
        pbVar13 = b;
      }
      iVar5 = (pbVar13->core).tid;
      if (fd->multi_seq == -1) {
        iVar3 = pcVar6->max_rec;
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        iVar3 = (iVar2 >> 2) + 10;
        if ((((pcVar6->curr_rec < iVar3) && (fd->last_slice != 0)) &&
            ((fd->last_slice < iVar3 && ((fd->embed_ref == 0 && (bVar15 = true, fd->verbose != 0))))
            )) && (pcVar6->multi_seq == 0)) {
          cram_put_bam_seq_cold_1();
        }
      }
      iVar3 = pcVar6->curr_rec;
      iVar2 = pcVar6->slice_rec;
      if (((((fd->version & 0xffffff00U) == 0x100) || (iVar3 == pcVar6->max_rec)) ||
          (fd->multi_seq != 1)) || (pcVar6->slice == (cram_slice *)0x0)) {
        pcVar6 = fd->ctr;
        if (pcVar6->curr_ref == -2) {
          pcVar6->curr_ref = (b->core).tid;
        }
        pcVar7 = pcVar6->slice;
        if (pcVar7 != (cram_slice *)0x0) {
          if (pcVar6->multi_seq == 0) {
            pcVar11 = pcVar7->hdr;
            pcVar11->ref_seq_id = pcVar6->curr_ref;
            iVar4 = pcVar6->first_base;
            pcVar11->ref_seq_start = iVar4;
            iVar12 = (pcVar6->last_base - iVar4) + 1;
          }
          else {
            pcVar11 = pcVar7->hdr;
            pcVar11->ref_seq_id = -2;
            pcVar11->ref_seq_start = 0;
            iVar12 = 0;
          }
          pcVar11->ref_seq_span = iVar12;
          pcVar11 = pcVar7->hdr;
          pcVar11->num_records = pcVar6->curr_rec;
          if (pcVar6->curr_slice == 0) {
            iVar4 = pcVar11->ref_seq_id;
            if (pcVar6->ref_seq_id != iVar4) {
              pcVar6->ref_seq_id = iVar4;
            }
            pcVar6->ref_seq_start = pcVar6->first_base;
          }
          pcVar6->curr_slice = pcVar6->curr_slice + 1;
        }
        if ((pcVar6->curr_slice == pcVar6->max_slice) ||
           (((b->core).tid != pcVar6->curr_ref && (pcVar6->multi_seq == 0)))) {
          pcVar6->ref_seq_span = (fd->last_base - pcVar6->ref_seq_start) + 1;
          if (fd->verbose != 0) {
            fprintf(_stderr,"Flush container %d/%d..%d\n",(ulong)(uint)pcVar6->ref_seq_id);
          }
          if (fd->pool == (t_pool *)0x0) {
            iVar4 = cram_flush_container(fd,pcVar6);
            if (iVar4 != -1) {
              if (0 < pcVar6->max_slice) {
                lVar14 = 0;
                do {
                  cram_free_slice(pcVar6->slices[lVar14]);
                  pcVar6->slices[lVar14] = (cram_slice *)0x0;
                  lVar14 = lVar14 + 1;
                } while (lVar14 < pcVar6->max_slice);
              }
              pcVar6->slice = (cram_slice *)0x0;
              pcVar6->curr_slice = 0;
              cram_free_container(pcVar6);
              goto LAB_00129cb2;
            }
          }
          else {
            iVar4 = cram_flush_container_mt(fd,pcVar6);
            if (iVar4 != -1) {
LAB_00129cb2:
              pcVar6 = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
              fd->ctr = pcVar6;
              if (pcVar6 != (cram_container *)0x0) {
                pcVar6->record_counter = fd->record_counter;
                pcVar6->curr_ref = (b->core).tid;
                goto LAB_00129cde;
              }
            }
          }
LAB_00129d39:
          pcVar6 = (cram_container *)0x0;
        }
        else {
LAB_00129cde:
          iVar4 = (b->core).pos + 1;
          pcVar6->last_base = iVar4;
          pcVar6->first_base = iVar4;
          pcVar6->last_pos = iVar4;
          pcVar7 = cram_new_slice(MAPPED_SLICE,pcVar6->max_rec);
          pcVar6->slices[pcVar6->curr_slice] = pcVar7;
          pcVar6->slice = pcVar7;
          if (pcVar7 == (cram_slice *)0x0) goto LAB_00129d39;
          if (pcVar6->multi_seq == 0) {
            pcVar11 = pcVar7->hdr;
            pcVar11->ref_seq_id = (b->core).tid;
            iVar12 = (b->core).pos + 1;
            iVar4 = iVar12;
          }
          else {
            pcVar11 = pcVar7->hdr;
            pcVar11->ref_seq_id = -2;
            iVar12 = 0;
            iVar4 = 1;
          }
          pcVar11->ref_seq_start = iVar12;
          pcVar7->last_apos = iVar4;
          pcVar6->curr_rec = 0;
        }
        if (pcVar6 != (cram_container *)0x0) goto LAB_00129d66;
        if (fd->ctr != (cram_container *)0x0) {
          cram_free_container(fd->ctr);
          fd->ctr = (cram_container *)0x0;
        }
        bVar15 = false;
        pcVar6 = (cram_container *)0x0;
      }
      else {
LAB_00129d66:
        if (bVar15) {
          fd->multi_seq = 1;
          pcVar6->multi_seq = 1;
          pcVar6->pos_sorted = 0;
          if (pcVar6->refs_used != (int *)0x0) goto LAB_00129de1;
          pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
          piVar8 = (int *)calloc((long)fd->refs->nref,4);
          pcVar6->refs_used = piVar8;
          pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
          if (pcVar6->refs_used != (int *)0x0) goto LAB_00129de1;
LAB_00129fd4:
          bVar15 = false;
        }
        else {
LAB_00129de1:
          fd->last_slice = iVar3 - iVar2;
          pcVar6->slice_rec = pcVar6->curr_rec;
          iVar3 = (b->core).tid;
          if (((-1 < (long)iVar3) && (iVar3 != iVar5)) &&
             ((fd->embed_ref == 0 && (bVar15 && fd->unsorted == 0)))) {
            if (pcVar6->refs_used == (int *)0x0) {
              pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
              piVar8 = (int *)calloc((long)fd->refs->nref,4);
              pcVar6->refs_used = piVar8;
              pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
              if (pcVar6->refs_used == (int *)0x0) goto LAB_00129fd4;
            }
            else if (pcVar6->refs_used[iVar3] != 0) {
              cram_put_bam_seq_cold_2();
            }
          }
          uVar1 = (b->core).tid;
          pcVar6->curr_ref = uVar1;
          bVar15 = true;
          if (-1 < (int)uVar1 && pcVar6->refs_used != (int *)0x0) {
            piVar8 = pcVar6->refs_used + uVar1;
            *piVar8 = *piVar8 + 1;
          }
        }
      }
      if (!bVar15) {
        return -1;
      }
    }
    if (pcVar6->bams == (bam_seq_t **)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&fd->bam_list_lock);
      __ptr = fd->bl;
      if (__ptr == (spare_bams *)0x0) {
        ppbVar9 = (bam_seq_t **)calloc((long)pcVar6->max_c_rec,8);
        pcVar6->bams = ppbVar9;
        if (ppbVar9 == (bam_seq_t **)0x0) goto LAB_00129fc0;
      }
      else {
        pcVar6->bams = __ptr->bams;
        fd->bl = __ptr->next;
        free(__ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&fd->bam_list_lock);
    }
    if (pcVar6->bams[pcVar6->curr_c_rec] == (bam1_t *)0x0) {
      pbVar10 = bam_init1();
      pbVar10 = bam_copy1(pbVar10,b);
      pcVar6->bams[pcVar6->curr_c_rec] = pbVar10;
    }
    else {
      bam_copy1(pcVar6->bams[pcVar6->curr_c_rec],b);
    }
    pcVar6->curr_rec = pcVar6->curr_rec + 1;
    pcVar6->curr_c_rec = pcVar6->curr_c_rec + 1;
    fd->record_counter = fd->record_counter + 1;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int cram_put_bam_seq(cram_fd *fd, bam_seq_t *b) {
    cram_container *c;

    if (!fd->ctr) {
	fd->ctr = cram_new_container(fd->seqs_per_slice,
				     fd->slices_per_container);
	if (!fd->ctr)
	    return -1;
	fd->ctr->record_counter = fd->record_counter;
    }
    c = fd->ctr;

    if (!c->slice || c->curr_rec == c->max_rec ||
	(bam_ref(b) != c->curr_ref && c->curr_ref >= -1)) {
	int slice_rec, curr_rec, multi_seq = fd->multi_seq == 1;
	int curr_ref = c->slice ? c->curr_ref : bam_ref(b);


	/*
	 * Start packing slices when we routinely have under 1/4tr full.
	 *
	 * This option isn't available if we choose to embed references
	 * since we can only have one per slice.
	 */
	if (fd->multi_seq == -1 && c->curr_rec < c->max_rec/4+10 &&
	    fd->last_slice && fd->last_slice < c->max_rec/4+10 &&
	    !fd->embed_ref) {
	    if (fd->verbose && !c->multi_seq)
		fprintf(stderr, "Multi-ref enabled for this container\n");
	    multi_seq = 1;
	}

	slice_rec = c->slice_rec;
	curr_rec  = c->curr_rec;

	if (CRAM_MAJOR_VERS(fd->version) == 1 ||
	    c->curr_rec == c->max_rec || fd->multi_seq != 1 || !c->slice) {
	    if (NULL == (c = cram_next_container(fd, b))) {
		if (fd->ctr) {
		    // prevent cram_close attempting to flush
		    cram_free_container(fd->ctr);
		    fd->ctr = NULL;
		}
		return -1;
	    }
	}

	/*
	 * Due to our processing order, some things we've already done we
	 * cannot easily undo. So when we first notice we should be packing
	 * multiple sequences per container we emit the small partial
	 * container as-is and then start a fresh one in a different mode.
	 */
	if (multi_seq) {
	    fd->multi_seq = 1;
	    c->multi_seq = 1;
	    c->pos_sorted = 0; // required atm for multi_seq slices

	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    }
	}

	fd->last_slice = curr_rec - slice_rec;
	c->slice_rec = c->curr_rec;

	// Have we seen this reference before?
	if (bam_ref(b) >= 0 && bam_ref(b) != curr_ref && !fd->embed_ref &&
	    !fd->unsorted && multi_seq) {
	    
	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    } else if (c->refs_used && c->refs_used[bam_ref(b)]) {
		fprintf(stderr, "Unsorted mode enabled\n");
		pthread_mutex_lock(&fd->ref_lock);
		fd->unsorted = 1;
		pthread_mutex_unlock(&fd->ref_lock);
		fd->multi_seq = 1;
	    }
	}

	c->curr_ref = bam_ref(b);
	if (c->refs_used && c->curr_ref >= 0) c->refs_used[c->curr_ref]++;
    }

    if (!c->bams) {
	/* First time through, allocate a set of bam pointers */
	pthread_mutex_lock(&fd->bam_list_lock);
	if (fd->bl) {
	    spare_bams *spare = fd->bl;
	    c->bams = spare->bams;
	    fd->bl = spare->next;
	    free(spare);
	} else {
	    c->bams = calloc(c->max_c_rec, sizeof(bam_seq_t *));
	    if (!c->bams)
		return -1;
	}
	pthread_mutex_unlock(&fd->bam_list_lock);
    }

    /* Copy or alloc+copy the bam record, for later encoding */
    if (c->bams[c->curr_c_rec])
	bam_copy1(c->bams[c->curr_c_rec], b);
    else
	c->bams[c->curr_c_rec] = bam_dup(b);

    c->curr_rec++;
    c->curr_c_rec++;
    fd->record_counter++;

    return 0;
}